

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O0

mz_bool mz_zip_reader_end_internal(mz_zip_archive *pZip,mz_bool set_last_error)

{
  mz_zip_internal_state *__s;
  int iVar1;
  mz_zip_internal_state *pState;
  mz_bool status;
  mz_bool set_last_error_local;
  mz_zip_archive *pZip_local;
  
  pState._0_4_ = 1;
  if (pZip == (mz_zip_archive *)0x0) {
    pZip_local._4_4_ = 0;
  }
  else if ((((pZip->m_pState == (mz_zip_internal_state *)0x0) ||
            (pZip->m_pAlloc == (mz_alloc_func)0x0)) || (pZip->m_pFree == (mz_free_func)0x0)) ||
          (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    if (set_last_error != 0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    pZip_local._4_4_ = 0;
  }
  else {
    if (pZip->m_pState != (mz_zip_internal_state *)0x0) {
      __s = pZip->m_pState;
      pZip->m_pState = (mz_zip_internal_state *)0x0;
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(__s->m_central_dir).m_p);
      memset(__s,0,0x20);
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(__s->m_central_dir_offsets).m_p);
      memset(&__s->m_central_dir_offsets,0,0x20);
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(__s->m_sorted_central_dir_offsets).m_p);
      memset(&__s->m_sorted_central_dir_offsets,0,0x20);
      if (__s->m_pFile != (FILE *)0x0) {
        if ((pZip->m_zip_type == MZ_ZIP_TYPE_FILE) &&
           (iVar1 = fclose((FILE *)__s->m_pFile), iVar1 == -1)) {
          if (set_last_error != 0) {
            pZip->m_last_error = MZ_ZIP_FILE_CLOSE_FAILED;
          }
          pState._0_4_ = 0;
        }
        __s->m_pFile = (FILE *)0x0;
      }
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,__s);
    }
    pZip->m_zip_mode = MZ_ZIP_MODE_INVALID;
    pZip_local._4_4_ = (mz_bool)pState;
  }
  return pZip_local._4_4_;
}

Assistant:

static mz_bool mz_zip_reader_end_internal(mz_zip_archive *pZip, mz_bool set_last_error)
{
    mz_bool status = MZ_TRUE;

    if (!pZip)
        return MZ_FALSE;

    if ((!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    {
        if (set_last_error)
            pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;

        return MZ_FALSE;
    }

    if (pZip->m_pState)
    {
        mz_zip_internal_state *pState = pZip->m_pState;
        pZip->m_pState = NULL;

        mz_zip_array_clear(pZip, &pState->m_central_dir);
        mz_zip_array_clear(pZip, &pState->m_central_dir_offsets);
        mz_zip_array_clear(pZip, &pState->m_sorted_central_dir_offsets);

#ifndef MINIZ_NO_STDIO
        if (pState->m_pFile)
        {
            if (pZip->m_zip_type == MZ_ZIP_TYPE_FILE)
            {
                if (MZ_FCLOSE(pState->m_pFile) == EOF)
                {
                    if (set_last_error)
                        pZip->m_last_error = MZ_ZIP_FILE_CLOSE_FAILED;
                    status = MZ_FALSE;
                }
            }
            pState->m_pFile = NULL;
        }
#endif /* #ifndef MINIZ_NO_STDIO */

        pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    }
    pZip->m_zip_mode = MZ_ZIP_MODE_INVALID;

    return status;
}